

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Array<kj::String> * __thiscall
kj::anon_unknown_35::InMemoryDirectory::listNames
          (Array<kj::String> *__return_storage_ptr__,InMemoryDirectory *this)

{
  Impl *pIVar1;
  anon_class_1_0_00000001 local_3d [13];
  Mapper<const_std::map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>_&>
  local_30;
  undefined1 local_28 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  InMemoryDirectory *this_local;
  
  lock.ptr = (Impl *)this;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_28);
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_28);
  kj::_::
  Mapper<const_std::map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>_&>
  ::Mapper(&local_30,&pIVar1->entries);
  kj::_::
  Mapper<const_std::map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>_&>
  ::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1001:12)>
            (__return_storage_ptr__,&local_30,local_3d);
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

Array<String> listNames() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) { return heapString(e.first); };
  }